

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O3

void __thiscall
icu_63::numparse::impl::AffixPatternMatcherBuilder::addMatcher
          (AffixPatternMatcherBuilder *this,NumberParseMatcher *matcher)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  NumberParseMatcher **__src;
  NumberParseMatcher **__dest;
  uint uVar5;
  
  uVar2 = this->fMatchersLen;
  if (((this->fMatchers).capacity <= (int)uVar2) && (0 < (int)uVar2)) {
    uVar1 = uVar2 * 2;
    __dest = (NumberParseMatcher **)uprv_malloc_63((ulong)uVar1 << 3);
    if (__dest != (NumberParseMatcher **)0x0) {
      uVar3 = (this->fMatchers).capacity;
      uVar5 = uVar2;
      if ((int)uVar3 < (int)uVar2) {
        uVar5 = uVar3;
      }
      if (SBORROW4(uVar5,uVar1) == (int)(uVar5 + uVar2 * -2) < 0) {
        uVar5 = uVar1;
      }
      __src = (this->fMatchers).ptr;
      memcpy(__dest,__src,(long)(int)uVar5 << 3);
      if ((this->fMatchers).needToRelease != '\0') {
        uprv_free_63(__src);
      }
      (this->fMatchers).ptr = __dest;
      (this->fMatchers).capacity = uVar1;
      (this->fMatchers).needToRelease = '\x01';
    }
  }
  iVar4 = this->fMatchersLen;
  this->fMatchersLen = iVar4 + 1;
  (this->fMatchers).ptr[iVar4] = matcher;
  return;
}

Assistant:

void AffixPatternMatcherBuilder::addMatcher(NumberParseMatcher& matcher) {
    if (fMatchersLen >= fMatchers.getCapacity()) {
        fMatchers.resize(fMatchersLen * 2, fMatchersLen);
    }
    fMatchers[fMatchersLen++] = &matcher;
}